

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

void __thiscall
helics::apps::Player::addPublication
          (Player *this,string_view name,DataType type,string_view pubUnits)

{
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *this_00;
  _Map_pointer ppPVar1;
  element_type *peVar2;
  _func_int *p_Var3;
  size_type __n1;
  int iVar4;
  iterator iVar5;
  size_type sVar6;
  string *psVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  int iVar10;
  _Elt_pointer pPVar11;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string_view keyname;
  basic_string_view<char,_std::char_traits<char>_> localName;
  DataType local_64;
  key_type local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  key_type local_40;
  key_type local_30;
  
  local_50._M_str = pubUnits._M_str;
  local_50._M_len = pubUnits._M_len;
  local_40._M_str = name._M_str;
  local_40._M_len = name._M_len;
  this_00 = &this->pubids;
  local_64 = type;
  iVar5 = CLI::std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,&local_40);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"publication already exists\n",0x1b);
    return;
  }
  if ((this->super_App).useLocal != false) {
    sVar6 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      (&local_40,"./",0,2);
    if (sVar6 == 0xffffffffffffffff) {
      local_60._M_len =
           (size_t)(this->super_App).fed.
                   super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
      std::deque<helics::Publication,std::allocator<helics::Publication>>::
      emplace_back<helics::CombinationFederate*,std::basic_string_view<char,std::char_traits<char>>&,helics::DataType&,std::basic_string_view<char,std::char_traits<char>>&>
                ((deque<helics::Publication,std::allocator<helics::Publication>> *)
                 &this->publications,(CombinationFederate **)&local_60,&local_40,&local_64,&local_50
                );
      goto LAB_001c4ad6;
    }
  }
  local_30._M_len = CONCAT44(local_30._M_len._4_4_,1);
  local_60._M_len =
       (size_t)(this->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::deque<helics::Publication,std::allocator<helics::Publication>>::
  emplace_back<helics::InterfaceVisibility,helics::CombinationFederate*,std::basic_string_view<char,std::char_traits<char>>&,helics::DataType&,std::basic_string_view<char,std::char_traits<char>>&>
            ((deque<helics::Publication,std::allocator<helics::Publication>> *)&this->publications,
             (InterfaceVisibility *)&local_30,(CombinationFederate **)&local_60,&local_40,&local_64,
             &local_50);
LAB_001c4ad6:
  pPVar11 = (this->publications).
            super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (pPVar11 ==
      (this->publications).
      super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pPVar11 = (this->publications).
              super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node[-1] + 2;
  }
  psVar7 = Interface::getName_abi_cxx11_(&pPVar11[-1].super_Interface);
  local_60._M_str = (psVar7->_M_dataplus)._M_p;
  local_60._M_len = psVar7->_M_string_length;
  ppPVar1 = (this->publications).
            super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar10 = (int)((ulong)((long)(this->publications).
                               super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_last -
                        (long)(this->publications).
                              super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x3d70a3d7 +
           (int)((ulong)((long)(this->publications).
                               super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                        (long)(this->publications).
                              super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) *
           -0x3d70a3d7 +
           ((int)((ulong)((long)ppPVar1 -
                         (long)(this->publications).
                               super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
           (uint)(ppPVar1 == (_Map_pointer)0x0)) * 2 + -1;
  pmVar8 = CLI::std::__detail::
           _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,&local_60);
  *pmVar8 = iVar10;
  if ((this->super_App).useLocal == true) {
    peVar2 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var3 = (peVar2->super_ValueFederate)._vptr_ValueFederate[-3];
    __n1 = *(size_type *)(&(peVar2->super_ValueFederate).field_0x80 + (long)p_Var3);
    __str._M_str = *(char **)(&(peVar2->super_ValueFederate).field_0x78 + (long)p_Var3);
    __str._M_len = __n1;
    iVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (&local_60,0,__n1,__str);
    if (iVar4 == 0) {
      uVar9 = *(long *)(&(peVar2->super_ValueFederate).field_0x80 + (long)p_Var3) + 1;
      if (local_60._M_len < uVar9) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
      }
      local_30._M_str = local_60._M_str + uVar9;
      local_30._M_len = local_60._M_len - uVar9;
      pmVar8 = CLI::std::__detail::
               _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,&local_30);
      *pmVar8 = iVar10;
    }
  }
  return;
}

Assistant:

void Player::addPublication(std::string_view name, DataType type, std::string_view pubUnits)
{
    // skip already existing publications
    if (pubids.find(name) != pubids.end()) {
        std::cerr << "publication already exists\n";
        return;
    }
    if (!useLocal) {
        publications.emplace_back(
            helics::InterfaceVisibility::GLOBAL, fed.get(), name, type, pubUnits);
    } else {
        auto kp = name.find_first_of("./");
        if (kp == std::string::npos) {
            publications.emplace_back(fed.get(), name, type, pubUnits);
        } else {
            publications.emplace_back(
                helics::InterfaceVisibility::GLOBAL, fed.get(), name, type, pubUnits);
        }
    }
    std::string_view keyname = publications.back().getName();
    auto index = static_cast<int>(publications.size()) - 1;
    pubids[keyname] = index;
    if (useLocal) {
        auto& fedName = fed->getName();
        if (keyname.compare(0, fedName.size(), fedName) == 0) {
            auto localName = keyname.substr(fedName.size() + 1);
            pubids[localName] = index;
        }
    }
}